

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

DString * stdin_buffer(void)

{
  DString *baseString;
  size_t bytes;
  char chunk [4096];
  char acStack_1018 [4096];
  
  baseString = d_string_new("");
  bytes = fread(acStack_1018,1,0x1000,_stdin);
  while (bytes != 0) {
    d_string_append_c_array(baseString,acStack_1018,bytes);
    bytes = fread(acStack_1018,1,0x1000,_stdin);
  }
  fclose(_stdin);
  return baseString;
}

Assistant:

DString * stdin_buffer() {
	/* Read from stdin and return a GString *
		`buffer` will need to be freed elsewhere */

	char chunk[kBUFFERSIZE];
	size_t bytes;

	DString * buffer = d_string_new("");

	while ((bytes = fread(chunk, 1, kBUFFERSIZE, stdin)) > 0) {
		d_string_append_c_array(buffer, chunk, bytes);
	}

	fclose(stdin);

	return buffer;
}